

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

void target_add_call_arg_op(c2m_ctx_t c2m_ctx,type *arg_type,target_arg_info_t *arg_info,op_t arg)

{
  undefined8 *puVar1;
  ulong uVar2;
  anon_union_32_12_57d33f68_for_u *paVar3;
  decl_t pdVar4;
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar5;
  op_t mem;
  uint uVar6;
  MIR_type_t MVar7;
  MIR_type_t *qword_types_00;
  MIR_op_t *pMVar8;
  undefined1 *puVar9;
  void *pvVar10;
  MIR_insn_t_conflict insn;
  type *ret_type;
  MIR_insn_code_t code;
  size_t sVar11;
  VARR_MIR_op_t *pVVar12;
  ulong uVar13;
  c2m_ctx_t c2m_ctx_00;
  gen_ctx_conflict *pgVar14;
  MIR_type_t qword_types [2];
  MIR_type_t aMStack_170 [2];
  MIR_op_t MStack_168;
  target_arg_info_t *ptStack_130;
  c2m_ctx_t pcStack_128;
  op_t *poStack_120;
  gen_ctx_conflict *pgStack_118;
  type *ptStack_110;
  VARR_MIR_op_t *pVStack_108;
  code *pcStack_100;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined8 in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  char in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff21;
  undefined1 in_stack_ffffffffffffff28;
  MIR_scale_t in_stack_ffffffffffffff29;
  MIR_scale_t MVar15;
  undefined6 in_stack_ffffffffffffff2a;
  undefined8 in_stack_ffffffffffffff30;
  MIR_reg_t in_stack_ffffffffffffff38;
  MIR_reg_t MVar16;
  MIR_reg_t in_stack_ffffffffffffff3c;
  MIR_reg_t MVar17;
  undefined8 in_stack_ffffffffffffff40;
  long lVar18;
  MIR_type_t local_b0 [2];
  undefined1 local_a8 [16];
  void *pvStack_98;
  char *pcStack_90;
  anon_union_32_12_57d33f68_for_u aStack_88;
  undefined1 local_68 [24];
  char *pcStack_50;
  int64_t iStack_48;
  char *pcStack_40;
  
  c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->ctx;
  pgVar14 = c2m_ctx->gen_ctx;
  qword_types_00 = local_b0;
  pcStack_100 = (code *)0x1ab43f;
  uVar6 = process_aggregate_arg(c2m_ctx,arg_type,arg_info,qword_types_00);
  pVVar12 = (VARR_MIR_op_t *)(ulong)uVar6;
  if ((arg_type->mode & ~TM_BASIC) == TM_STRUCT) {
    if (arg.mir_op._8_1_ != '\n') {
      pcStack_100 = (code *)0x1ab645;
      __assert_fail("arg.mir_op.mode == MIR_OP_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                    ,0x192,
                    "void target_add_call_arg_op(c2m_ctx_t, struct type *, target_arg_info_t *, op_t)"
                   );
    }
    in_stack_ffffffffffffff0c = (undefined4)((ulong)arg.decl >> 0x20);
    in_stack_ffffffffffffff28 = (undefined1)arg.mir_op.u.reg;
    in_stack_ffffffffffffff29 = (MIR_scale_t)((uint)arg.mir_op.u._0_4_ >> 8);
    in_stack_ffffffffffffff2a =
         (undefined6)(CONCAT44(arg.mir_op.u.mem.alias,arg.mir_op.u.reg) >> 0x10);
    in_stack_ffffffffffffff38 = (MIR_reg_t)arg.mir_op.u._16_8_;
    in_stack_ffffffffffffff3c = (MIR_reg_t)((ulong)arg.mir_op.u._16_8_ >> 0x20);
    pcStack_100 = (code *)0x1ab482;
    mem._8_8_ = arg._8_8_;
    mem.decl = arg.decl;
    mem.mir_op.data = arg.mir_op.data;
    mem.mir_op._8_1_ = 10;
    mem.mir_op._9_7_ = arg.mir_op._9_7_;
    mem.mir_op.u.reg._0_1_ = in_stack_ffffffffffffff28;
    mem.mir_op.u.mem.scale = in_stack_ffffffffffffff29;
    mem.mir_op.u.i._2_6_ = in_stack_ffffffffffffff2a;
    mem.mir_op.u.str.s = arg.mir_op.u.str.s;
    mem.mir_op.u.mem.base = in_stack_ffffffffffffff38;
    mem.mir_op.u.mem.index = in_stack_ffffffffffffff3c;
    mem.mir_op.u.mem.disp = arg.mir_op.u.mem.disp;
    in_stack_ffffffffffffff10 = arg._8_8_;
    in_stack_ffffffffffffff18 = arg.mir_op.data;
    in_stack_ffffffffffffff20 = arg.mir_op._8_1_;
    in_stack_ffffffffffffff21 = arg.mir_op._9_7_;
    in_stack_ffffffffffffff30 = arg.mir_op.u.str.s;
    in_stack_ffffffffffffff40 = arg.mir_op.u.mem.disp;
    mem_to_address((op_t *)local_a8,c2m_ctx,mem,1);
    arg.decl = (decl_t)local_a8._0_8_;
    arg._8_8_ = local_a8._8_8_;
    arg.mir_op.data = pvStack_98;
    arg.mir_op._8_1_ = SUB81(pcStack_90,0);
    arg.mir_op._9_7_ = SUB87((ulong)pcStack_90 >> 8,0);
    arg.mir_op.u.reg = (MIR_reg_t)aStack_88.i;
    arg.mir_op.u.mem.alias = (MIR_alias_t)((ulong)aStack_88._0_8_ >> 0x20);
    arg.mir_op.u.str.s = aStack_88.str.s;
    arg.mir_op.u._16_8_ = aStack_88._16_8_;
    arg.mir_op.u.mem.disp = aStack_88.mem.disp;
    pcStack_100 = (code *)0x1ab49e;
    MVar7 = get_blk_type(uVar6,local_b0);
    arg_info = (target_arg_info_t *)(ulong)MVar7;
    pVVar12 = pgVar14->call_ops;
    pcStack_100 = (code *)0x1ab4b2;
    qword_types_00 = (MIR_type_t *)raw_type_size(c2m_ctx,arg_type);
    uVar13 = (ulong)arg_type->align;
    if (uVar13 != 0) {
      uVar2 = (long)qword_types_00 + (uVar13 - 1);
      qword_types_00 = (MIR_type_t *)(uVar2 - uVar2 % uVar13);
    }
    in_stack_ffffffffffffff08 = 1;
    arg_type = (type *)local_68;
    pcStack_100 = (code *)0x1ab4f3;
    MIR_new_mem_op((MIR_op_t *)arg_type,(MIR_context_t)c2m_ctx_00,MVar7,(MIR_disp_t)qword_types_00,
                   arg.mir_op.u.reg,0,'\x01');
    aStack_88.i = iStack_48;
    aStack_88.str.s = pcStack_40;
    local_a8._0_8_ = local_68._0_8_;
    local_a8._8_8_ = local_68._8_8_;
    pvStack_98 = (void *)local_68._16_8_;
    pcStack_90 = pcStack_50;
    pMVar8 = pVVar12->varr;
    if (pMVar8 == (MIR_op_t *)0x0) {
LAB_001ab64a:
      pcStack_100 = VARR_MIR_op_taddr;
      target_add_call_arg_op_cold_2();
      if (pMVar8 != (MIR_op_t *)0x0) {
        return;
      }
      pVStack_108 = (VARR_MIR_op_t *)target_gen_post_call_res_code;
      VARR_MIR_op_taddr_cold_1();
      ctx = c2m_ctx_00->ctx;
      pgVar5 = c2m_ctx_00->gen_ctx;
      if ((ret_type->mode != TM_BASIC) ||
         (MVar15 = in_stack_ffffffffffffff29, MVar16 = in_stack_ffffffffffffff38,
         MVar17 = in_stack_ffffffffffffff3c, lVar18 = in_stack_ffffffffffffff40,
         (ret_type->u).basic_type != TP_VOID)) {
        ptStack_130 = arg_info;
        pcStack_128 = c2m_ctx;
        poStack_120 = &arg;
        pgStack_118 = pgVar14;
        ptStack_110 = arg_type;
        pVStack_108 = pVVar12;
        uVar6 = process_ret_type(c2m_ctx_00,ret_type,aMStack_170);
        MVar15 = in_stack_ffffffffffffff29;
        MVar16 = in_stack_ffffffffffffff38;
        MVar17 = in_stack_ffffffffffffff3c;
        lVar18 = in_stack_ffffffffffffff40;
        if (uVar6 != 0) {
          if (in_stack_ffffffffffffff20 != '\n') {
LAB_001ab827:
            __assert_fail("res.mir_op.mode == MIR_OP_MEM",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0x100,
                          "op_t target_gen_post_call_res_code(c2m_ctx_t, struct type *, op_t, MIR_insn_t, size_t)"
                         );
          }
          if (0 < (int)uVar6) {
            uVar13 = 0;
            do {
              MVar7 = aMStack_170[uVar13];
              if (MVar7 == MIR_T_F) {
                code = MIR_FMOV;
              }
              else if (MVar7 == MIR_T_D) {
                code = MIR_DMOV;
              }
              else {
                code = (uint)(MVar7 == MIR_T_LD) * 3;
              }
              MIR_new_mem_op(&MStack_168,ctx,MVar7,in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff38,in_stack_ffffffffffffff3c,
                             in_stack_ffffffffffffff29);
              pVVar12 = pgVar5->call_ops;
              if (((pVVar12 == (VARR_MIR_op_t *)0x0) || (pVVar12->varr == (MIR_op_t *)0x0)) ||
                 (pVVar12->els_num <= (long)qword_types_00 + uVar13 + 2)) {
                target_gen_post_call_res_code_cold_1();
                goto LAB_001ab827;
              }
              insn = MIR_new_insn(ctx,code);
              MIR_append_insn(ctx,pgVar5->curr_func,insn);
              uVar13 = uVar13 + 1;
              in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 8;
            } while (uVar6 != uVar13);
          }
        }
      }
      pMVar8->data = (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      *(undefined8 *)&pMVar8->field_0x8 = in_stack_ffffffffffffff10;
      (pMVar8->u).i = (int64_t)in_stack_ffffffffffffff18;
      (pMVar8->u).str.s = (char *)CONCAT71(in_stack_ffffffffffffff21,in_stack_ffffffffffffff20);
      *(ulong *)((long)&pMVar8->u + 0x10) =
           CONCAT62(in_stack_ffffffffffffff2a,CONCAT11(MVar15,in_stack_ffffffffffffff28));
      (pMVar8->u).mem.disp = in_stack_ffffffffffffff30;
      pMVar8[1].data = (void *)CONCAT44(MVar17,MVar16);
      *(long *)&pMVar8[1].field_0x8 = lVar18;
      return;
    }
    uVar13 = pVVar12->els_num + 1;
    if (pVVar12->size < uVar13) {
      sVar11 = (uVar13 >> 1) + uVar13;
      pcStack_100 = (code *)0x1ab540;
      pMVar8 = (MIR_op_t *)realloc(pMVar8,sVar11 * 0x30);
      pVVar12->varr = pMVar8;
      pVVar12->size = sVar11;
    }
    sVar11 = pVVar12->els_num;
    pMVar8 = pVVar12->varr;
    pVVar12->els_num = sVar11 + 1;
    paVar3 = &pMVar8[sVar11].u;
    paVar3->i = (int64_t)pvStack_98;
    (&paVar3->i)[1] = (int64_t)pcStack_90;
    (&paVar3->i)[2] = aStack_88.i;
    (&paVar3->i)[3] = (int64_t)aStack_88.str.s;
    pMVar8 = pMVar8 + sVar11;
    pMVar8->data = (void *)local_a8._0_8_;
    *(undefined8 *)&pMVar8->field_0x8 = local_a8._8_8_;
    (pMVar8->u).i = (int64_t)pvStack_98;
    (pMVar8->u).str.s = pcStack_90;
  }
  else {
    pcStack_100 = (code *)0x1ab587;
    c2m_ctx_00 = (c2m_ctx_t)arg_type;
    MVar7 = get_mir_type(c2m_ctx,arg_type);
    pgVar14 = (gen_ctx_conflict *)pgVar14->call_ops;
    pMVar8 = (MIR_op_t *)(pgVar14->zero_op).mir_op.data;
    if (pMVar8 == (MIR_op_t *)0x0) {
      pcStack_100 = (code *)0x1ab64a;
      target_add_call_arg_op_cold_1();
      goto LAB_001ab64a;
    }
    puVar9 = &((pgVar14->zero_op).decl)->field_0x1;
    if (*(undefined1 **)&(pgVar14->zero_op).field_0x8 < puVar9) {
      pcStack_100 = (code *)0x1ab5c6;
      pvVar10 = realloc(pMVar8,(long)(puVar9 + ((ulong)puVar9 >> 1)) * 0x30);
      (pgVar14->zero_op).mir_op.data = pvVar10;
      *(undefined1 **)&(pgVar14->zero_op).field_0x8 = puVar9 + ((ulong)puVar9 >> 1);
    }
    pdVar4 = (pgVar14->zero_op).decl;
    pvVar10 = (pgVar14->zero_op).mir_op.data;
    (pgVar14->zero_op).decl = (decl_t)&pdVar4->field_0x1;
    *(ulong *)((long)pvVar10 + (long)pdVar4 * 0x30 + 0x10) =
         CONCAT44(arg.mir_op.u.mem.alias,arg.mir_op.u.reg);
    *(char **)((long)pvVar10 + (long)pdVar4 * 0x30 + 0x18) = arg.mir_op.u.str.s;
    *(undefined8 *)((long)pvVar10 + (long)pdVar4 * 0x30 + 0x20) = arg.mir_op.u._16_8_;
    *(MIR_disp_t *)((long)pvVar10 + (long)pdVar4 * 0x30 + 0x28) = arg.mir_op.u.mem.disp;
    puVar1 = (undefined8 *)((long)pvVar10 + (long)pdVar4 * 0x30);
    *puVar1 = arg.mir_op.data;
    puVar1[1] = CONCAT71(arg.mir_op._9_7_,arg.mir_op._8_1_);
    puVar1[2] = CONCAT44(arg.mir_op.u.mem.alias,arg.mir_op.u.reg);
    puVar1[3] = arg.mir_op.u.str.s;
    if ((MVar7 & 0x1e) == MIR_T_F) {
      arg_info->n_fregs = arg_info->n_fregs + 1;
    }
    else if (MVar7 != MIR_T_LD) {
      arg_info->n_iregs = arg_info->n_iregs + 1;
    }
  }
  return;
}

Assistant:

static void target_add_call_arg_op (c2m_ctx_t c2m_ctx, struct type *arg_type,
                                    target_arg_info_t *arg_info, op_t arg) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  int n_qwords = process_aggregate_arg (c2m_ctx, arg_type, arg_info, qword_types);

  /* pass aggregates on the stack and pass by value for others: */
  if (arg_type->mode != TM_STRUCT && arg_type->mode != TM_UNION) {
    type = get_mir_type (c2m_ctx, arg_type);
    VARR_PUSH (MIR_op_t, call_ops, arg.mir_op);
    if (type == MIR_T_F || type == MIR_T_D)
      arg_info->n_fregs++;
    else if (type != MIR_T_LD)
      arg_info->n_iregs++;
  } else {
    assert (arg.mir_op.mode == MIR_OP_MEM);
    arg = mem_to_address (c2m_ctx, arg, TRUE);
    type = get_blk_type (n_qwords, qword_types);
    VARR_PUSH (MIR_op_t, call_ops,
               MIR_new_mem_op (ctx, type, type_size (c2m_ctx, arg_type), arg.mir_op.u.reg, 0, 1));
  }
}